

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb::BitpackingFetchRow<short>
               (ColumnSegment *segment,ColumnFetchState *state,row_t row_id,Vector *result,
               idx_t result_idx)

{
  data_ptr_t pdVar1;
  unsigned_long skip_count;
  short multiplier;
  BitpackingScanState<short,_short> scan_state;
  short local_107a;
  BitpackingScanState<short,_short> local_1078;
  
  BitpackingScanState<short,_short>::BitpackingScanState(&local_1078,segment);
  skip_count = NumericCastImpl<unsigned_long,_long,_false>::Convert(row_id);
  BitpackingScanState<short,_short>::Skip(&local_1078,segment,skip_count);
  pdVar1 = result->data;
  if (local_1078.current_group.mode == CONSTANT_DELTA) {
    TryCast::Operation<unsigned_long,short>(local_1078.current_group_offset,&local_107a,false);
    local_1078.current_constant =
         local_1078.current_constant * local_107a + local_1078.current_frame_of_reference;
  }
  else if (local_1078.current_group.mode != CONSTANT) {
    duckdb_fastpforlib::internal::fastunpack_half
              ((uint16_t *)
               (local_1078.current_group_ptr +
               ((local_1078.current_group_offset & 0xffffffffffffffe0) *
                (ulong)local_1078.current_width >> 3)),(uint16_t *)local_1078.decompression_buffer,
               (uint)local_1078.current_width);
    duckdb_fastpforlib::internal::fastunpack_half
              ((uint16_t *)
               ((long)(local_1078.current_group_ptr +
                      ((local_1078.current_group_offset & 0xffffffffffffffe0) *
                       (ulong)local_1078.current_width >> 3)) + (ulong)local_1078.current_width * 2)
               ,(uint16_t *)(local_1078.decompression_buffer + 0x10),(uint)local_1078.current_width)
    ;
    local_1078.current_constant =
         local_1078.decompression_buffer[(uint)local_1078.current_group_offset & 0x1f];
    *(short *)(pdVar1 + result_idx * 2) = local_1078.current_constant;
    local_1078.current_constant =
         local_1078.current_constant + local_1078.current_frame_of_reference;
    *(short *)(pdVar1 + result_idx * 2) = local_1078.current_constant;
    if (local_1078.current_group.mode != DELTA_FOR) goto LAB_005929a2;
    local_1078.current_constant = local_1078.current_constant + local_1078.current_delta_offset;
  }
  *(short *)(pdVar1 + result_idx * 2) = local_1078.current_constant;
LAB_005929a2:
  local_1078.super_SegmentScanState._vptr_SegmentScanState =
       (_func_int **)&PTR__BitpackingScanState_0197b218;
  BufferHandle::~BufferHandle(&local_1078.handle);
  return;
}

Assistant:

void BitpackingFetchRow(ColumnSegment &segment, ColumnFetchState &state, row_t row_id, Vector &result,
                        idx_t result_idx) {
	BitpackingScanState<T> scan_state(segment);
	scan_state.Skip(segment, NumericCast<idx_t>(row_id));

	D_ASSERT(scan_state.current_group_offset < BITPACKING_METADATA_GROUP_SIZE);

	D_ASSERT(result.GetVectorType() == VectorType::FLAT_VECTOR);
	T *result_data = FlatVector::GetData<T>(result);
	T *current_result_ptr = result_data + result_idx;

	idx_t offset_in_compression_group =
	    scan_state.current_group_offset % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE;

	data_ptr_t decompression_group_start_pointer =
	    scan_state.current_group_ptr +
	    (scan_state.current_group_offset - offset_in_compression_group) * scan_state.current_width / 8;

	//! Because FOR offsets all our values to be 0 or above, we can always skip sign extension here
	bool skip_sign_extend = true;

	if (scan_state.current_group.mode == BitpackingMode::CONSTANT) {
		*current_result_ptr = scan_state.current_constant;
		return;
	}

	if (scan_state.current_group.mode == BitpackingMode::CONSTANT_DELTA) {
		T multiplier;
		auto cast = TryCast::Operation<idx_t, T>(scan_state.current_group_offset, multiplier);
		(void)cast;
		D_ASSERT(cast);
#ifdef DEBUG
		// overflow check
		T result;
		bool multiply = TryMultiplyOperator::Operation(multiplier, scan_state.current_constant, result);
		bool add = TryAddOperator::Operation(result, scan_state.current_frame_of_reference, result);
		D_ASSERT(multiply && add);
#endif
		*current_result_ptr = (multiplier * scan_state.current_constant) + scan_state.current_frame_of_reference;
		return;
	}

	D_ASSERT(scan_state.current_group.mode == BitpackingMode::FOR ||
	         scan_state.current_group.mode == BitpackingMode::DELTA_FOR);

	BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(scan_state.decompression_buffer),
	                                     decompression_group_start_pointer, scan_state.current_width, skip_sign_extend);

	*current_result_ptr = scan_state.decompression_buffer[offset_in_compression_group];
	*current_result_ptr += scan_state.current_frame_of_reference;

	if (scan_state.current_group.mode == BitpackingMode::DELTA_FOR) {
		*current_result_ptr += scan_state.current_delta_offset;
	}
}